

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

ValueType * __thiscall
HighsHashTree<int,_void>::InnerLeaf<1>::find_entry
          (InnerLeaf<1> *this,uint64_t fullHash,int hashPos,int *key)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  HighsHashTableEntry<int,_void> *pHVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  
  uVar9 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  uVar2 = uVar9 >> 10;
  uVar1 = (this->occupation).occupation;
  if ((uVar1 >> (uVar2 & 0x3f) & 1) == 0) {
    return (ValueType *)0x0;
  }
  lVar6 = POPCOUNT(uVar1 >> ((byte)uVar2 & 0x3f));
  uVar9 = uVar9 & 0xffff;
  lVar8 = 0;
  do {
    lVar7 = lVar8;
    lVar8 = lVar7 + 1;
  } while (uVar9 < (this->hashes)._M_elems[lVar6 + lVar7 + -1]);
  iVar3 = (int)lVar6;
  iVar10 = this->size;
  if (((iVar10 - iVar3) + 2 == (int)lVar8) || ((this->hashes)._M_elems[lVar6 + lVar7 + -1] != uVar9)
     ) {
    bVar11 = false;
    iVar10 = iVar3 + (int)lVar8 + -2;
  }
  else {
    do {
      bVar11 = *key == (this->entries)._M_elems[lVar6 + lVar8 + -2].value_;
      if (bVar11) {
        iVar10 = iVar3 + (int)lVar8 + -2;
        goto LAB_00278e6a;
      }
      if ((iVar10 - iVar3) + 1 == (int)lVar8) goto LAB_00278e6a;
      lVar7 = lVar8 + 1;
      lVar4 = lVar8 + -1;
      lVar8 = lVar7;
    } while ((this->hashes)._M_elems[lVar6 + lVar4] == uVar9);
    iVar10 = iVar3 + (int)lVar7 + -2;
  }
LAB_00278e6a:
  pHVar5 = (HighsHashTableEntry<int,_void> *)0x0;
  if (bVar11) {
    pHVar5 = (this->entries)._M_elems + iVar10;
  }
  return &pHVar5->value_;
}

Assistant:

ValueType* find_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return nullptr;

      int pos = occupation.num_set_until(hashChunk) - 1;
      while (hashes[pos] > hash) ++pos;

      if (find_key(key, hash, pos)) return &entries[pos].value();

      return nullptr;
    }